

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_outputs_tests.cpp
# Opt level: O0

shared_ptr<wallet::CWallet> wallet::group_outputs_tests::NewWallet(NodeContext *m_node)

{
  pointer __args_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  AnnotatedMixin<std::recursive_mutex> *in_RSI;
  element_type *in_RDI;
  long in_FS_OFFSET;
  shared_ptr<wallet::CWallet> sVar1;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> wallet;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock4;
  CWallet *in_stack_000000e8;
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  *in_stack_ffffffffffffff58;
  element_type *records;
  undefined8 *puVar2;
  char *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  element_type *this;
  CWallet *in_stack_ffffffffffffffa0;
  CWallet *in_stack_ffffffffffffffb0;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  records = in_RDI;
  this = in_RDI;
  __args_1 = std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::get
                       ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                        in_stack_ffffffffffffff58);
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  puVar2 = &local_38;
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::map(in_stack_ffffffffffffff58);
  CreateMockableWalletDatabase((MockableData *)records);
  std::
  make_unique<wallet::CWallet,interfaces::Chain*,char_const(&)[1],std::unique_ptr<wallet::WalletDatabase,std::default_delete<wallet::WalletDatabase>>>
            ((Chain **)in_stack_ffffffffffffffb0,(char (*) [1])__args_1,
             (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             in_stack_ffffffffffffffa0);
  std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::~unique_ptr
            ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             records);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~map(in_stack_ffffffffffffff58);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator->
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             in_stack_ffffffffffffff58);
  CWallet::LoadWallet(in_stack_ffffffffffffffb0);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator->
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             in_stack_ffffffffffffff58);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff58);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)this,in_RSI,
             in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,(int)((ulong)puVar2 >> 0x20),
             SUB81((ulong)puVar2 >> 0x18,0));
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator->
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             in_stack_ffffffffffffff58);
  CWallet::SetWalletFlag(in_stack_ffffffffffffffa0,(uint64_t)this);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator->
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             in_stack_ffffffffffffff58);
  CWallet::SetupDescriptorScriptPubKeyMans(in_stack_000000e8);
  std::shared_ptr<wallet::CWallet>::
  shared_ptr<wallet::CWallet,std::default_delete<wallet::CWallet>,void>
            ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffff58,
             (unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)0xdaab78);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff58);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)records);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    sVar1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
    return (shared_ptr<wallet::CWallet>)
           sVar1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

static std::shared_ptr<CWallet> NewWallet(const node::NodeContext& m_node)
{
    std::unique_ptr<CWallet> wallet = std::make_unique<CWallet>(m_node.chain.get(), "", CreateMockableWalletDatabase());
    wallet->LoadWallet();
    LOCK(wallet->cs_wallet);
    wallet->SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
    wallet->SetupDescriptorScriptPubKeyMans();
    return wallet;
}